

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

void ffxmsg(int action,char *errmsg)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  bool bVar10;
  
  pcVar9 = ffxmsg::txtbuff[0];
  pcVar2 = ffxmsg::msgptr;
  iVar7 = ffxmsg::nummsg;
  switch(action) {
  case 1:
    if (0 < (long)ffxmsg::nummsg) {
      lVar5 = 0;
      do {
        **(undefined1 **)((long)ffxmsg::txtbuff + lVar5) = 0;
        lVar5 = lVar5 + 8;
      } while ((long)ffxmsg::nummsg * 8 != lVar5);
    }
    ffxmsg::nummsg = 0;
    pcVar2 = ffxmsg::msgptr;
    iVar7 = ffxmsg::nummsg;
    break;
  case 2:
    if (0 < ffxmsg::nummsg) {
      lVar5 = (long)ffxmsg::nummsg;
      do {
        lVar4 = lVar5 + -1;
        cVar1 = **(char **)(&DAT_00383898 + lVar5 * 8);
        **(char **)(&DAT_00383898 + lVar5 * 8) = '\0';
        if (lVar5 < 2) break;
        lVar5 = lVar4;
      } while (cVar1 != '\x1b');
      pcVar2 = ffxmsg::msgptr;
      iVar7 = (int)lVar4;
    }
    break;
  case 3:
    if (0 < ffxmsg::nummsg) {
      ffxmsg::nummsg = ffxmsg::nummsg - 1;
      *ffxmsg::txtbuff[(uint)ffxmsg::nummsg] = '\0';
      pcVar2 = ffxmsg::msgptr;
      iVar7 = ffxmsg::nummsg;
    }
    break;
  case 4:
    uVar8 = (ulong)(uint)(~(ffxmsg::nummsg >> 0x1f) & ffxmsg::nummsg);
    uVar6 = ffxmsg::nummsg;
    do {
      pcVar9 = ffxmsg::txtbuff[0];
      uVar6 = uVar6 - 1;
      bVar10 = uVar8 == 0;
      uVar8 = uVar8 - 1;
      if (bVar10) {
        *errmsg = '\0';
        return;
      }
      strcpy(errmsg,ffxmsg::txtbuff[0]);
      *pcVar9 = '\0';
      ffxmsg::nummsg = uVar6;
      if (uVar6 != 0) {
        memmove(ffxmsg::txtbuff,ffxmsg::txtbuff + 1,(ulong)uVar6 << 3);
      }
      pcVar2 = ffxmsg::msgptr;
      iVar7 = ffxmsg::nummsg;
    } while (*errmsg == '\x1b');
    break;
  case 5:
    cVar1 = *errmsg;
    while (ffxmsg::txtbuff[0] = pcVar9, pcVar2 = errmsg, cVar1 != '\0') {
      if (iVar7 == 0x19) {
        ffxmsg::tmpbuff = pcVar9;
        *pcVar9 = '\0';
        iVar7 = 0x18;
        lVar4 = 0x18;
        memmove(ffxmsg::txtbuff,ffxmsg::txtbuff + 1,0xc0);
LAB_0017bc71:
        ffxmsg::txtbuff[lVar4] = pcVar9;
      }
      else {
        lVar5 = 0;
        do {
          if (ffxmsg::errbuff[0][lVar5] == '\0') {
            lVar4 = (long)iVar7;
            pcVar9 = ffxmsg::errbuff[0] + lVar5;
            goto LAB_0017bc71;
          }
          lVar5 = lVar5 + 0x51;
        } while (lVar5 != 0x7e9);
      }
      strncat(ffxmsg::txtbuff[iVar7],errmsg,0x50);
      iVar7 = iVar7 + 1;
      sVar3 = strlen(errmsg);
      if (0x4f < sVar3) {
        sVar3 = 0x50;
      }
      cVar1 = errmsg[sVar3];
      errmsg = errmsg + sVar3;
      pcVar9 = ffxmsg::txtbuff[0];
    }
    break;
  case 6:
    lVar5 = (long)ffxmsg::nummsg;
    if (lVar5 == 0x19) {
      ffxmsg::tmpbuff = ffxmsg::txtbuff[0];
      *ffxmsg::txtbuff[0] = '\0';
      ffxmsg::nummsg = 0x18;
      lVar5 = 0x18;
      memmove(ffxmsg::txtbuff,ffxmsg::txtbuff + 1,0xc0);
LAB_0017be07:
      ffxmsg::txtbuff[lVar5] = pcVar9;
    }
    else {
      lVar4 = 0;
      do {
        if (ffxmsg::errbuff[0][lVar4] == '\0') {
          pcVar9 = ffxmsg::errbuff[0] + lVar4;
          goto LAB_0017be07;
        }
        lVar4 = lVar4 + 0x51;
      } while (lVar4 != 0x7e9);
    }
    pcVar9 = ffxmsg::txtbuff[ffxmsg::nummsg];
    pcVar9[0] = '\x1b';
    pcVar9[1] = '\0';
    pcVar2 = ffxmsg::msgptr;
    iVar7 = ffxmsg::nummsg + 1;
  }
  ffxmsg::nummsg = iVar7;
  ffxmsg::msgptr = pcVar2;
  return;
}

Assistant:

void ffxmsg( int action,
            char *errmsg)
/*
  general routine to get, put, or clear the error message stack.
  Use a static array rather than allocating memory as needed for
  the error messages because it is likely to be more efficient
  and simpler to implement.

  Action Code:
DelAll     1  delete all messages on the error stack 
DelMark    2  delete messages back to and including the 1st marker 
DelNewest  3  delete the newest message from the stack 
GetMesg    4  pop and return oldest message, ignoring marks 
PutMesg    5  add a new message to the stack 
PutMark    6  add a marker to the stack 

*/
{
    int ii;
    char markflag;
    static char *txtbuff[errmsgsiz], *tmpbuff, *msgptr;
    static char errbuff[errmsgsiz][81];  /* initialize all = \0 */
    static int nummsg = 0;

    FFLOCK;
    
    if (action == DelAll)  /* clear the whole message stack */
    {
      for (ii = 0; ii < nummsg; ii ++)
        *txtbuff[ii] = '\0';

      nummsg = 0;
    }
    else if (action == DelMark)  /* clear up to and including first marker */
    {
      while (nummsg > 0) {
        nummsg--;  
        markflag = *txtbuff[nummsg]; /* store possible marker character */
        *txtbuff[nummsg] = '\0';  /* clear the buffer for this msg */

        if (markflag == ESMARKER)
           break;   /* found a marker, so quit */
      }
    }
    else if (action == DelNewest)  /* remove newest message from stack */ 
    {
      if (nummsg > 0)
      {
        nummsg--;  
        *txtbuff[nummsg] = '\0';  /* clear the buffer for this msg */
      }
    }
    else if (action == GetMesg)  /* pop and return oldest message from stack */ 
    {                            /* ignoring markers */
      while (nummsg > 0)
      {
         strcpy(errmsg, txtbuff[0]);   /* copy oldest message to output */

         *txtbuff[0] = '\0';  /* clear the buffer for this msg */
           
         nummsg--;  
         for (ii = 0; ii < nummsg; ii++)
             txtbuff[ii] = txtbuff[ii + 1]; /* shift remaining pointers */

         if (errmsg[0] != ESMARKER) {   /* quit if this is not a marker */
            FFUNLOCK;
            return;
         }
       }
       errmsg[0] = '\0';  /*  no messages in the stack */
    }
    else if (action == PutMesg)  /* add new message to stack */
    {
     msgptr = errmsg;
     while (strlen(msgptr))
     {
      if (nummsg == errmsgsiz)
      {
        tmpbuff = txtbuff[0];  /* buffers full; reuse oldest buffer */
        *txtbuff[0] = '\0';  /* clear the buffer for this msg */

        nummsg--;
        for (ii = 0; ii < nummsg; ii++)
             txtbuff[ii] = txtbuff[ii + 1];   /* shift remaining pointers */

        txtbuff[nummsg] = tmpbuff;  /* set pointer for the new message */
      }
      else
      {
        for (ii = 0; ii < errmsgsiz; ii++)
        {
          if (*errbuff[ii] == '\0') /* find first empty buffer */
          {
            txtbuff[nummsg] = errbuff[ii];
            break;
          }
        }
      }

      strncat(txtbuff[nummsg], msgptr, 80);
      nummsg++;

      msgptr += minvalue(80, strlen(msgptr));
     }
    }
    else if (action == PutMark)  /* put a marker on the stack */
    {
      if (nummsg == errmsgsiz)
      {
        tmpbuff = txtbuff[0];  /* buffers full; reuse oldest buffer */
        *txtbuff[0] = '\0';  /* clear the buffer for this msg */

        nummsg--;
        for (ii = 0; ii < nummsg; ii++)
             txtbuff[ii] = txtbuff[ii + 1];   /* shift remaining pointers */

        txtbuff[nummsg] = tmpbuff;  /* set pointer for the new message */
      }
      else
      {
        for (ii = 0; ii < errmsgsiz; ii++)
        {
          if (*errbuff[ii] == '\0') /* find first empty buffer */
          {
            txtbuff[nummsg] = errbuff[ii];
            break;
          }
        }
      }

      *txtbuff[nummsg] = ESMARKER;      /* write the marker */
      *(txtbuff[nummsg] + 1) = '\0';
      nummsg++;

    }

    FFUNLOCK;
    return;
}